

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_kfold_strref_snew(jit_State *J)

{
  IRRef1 IVar1;
  IRRef1 IVar2;
  IRRef1 IVar3;
  TRef TVar4;
  IRIns *pIVar5;
  IRRef1 str;
  IRIns *ir;
  jit_State *J_local;
  
  if (((J->fold).left[0].field_1.t.irt & 0x40) == 0) {
    if (((J->fold).ins.field_0.op2 < 0x8000) && ((J->fold).right[0].field_1.op12 == 0)) {
      J_local._4_4_ = (uint)(J->fold).left[0].field_0.op1;
    }
    else {
      pIVar5 = (J->cur).ir + (J->fold).left[0].field_0.op1;
      if ((pIVar5->field_1).o == '@') {
        IVar1 = (pIVar5->field_0).op1;
        if (((pIVar5->field_1).t.irt & 0x40) == 0) {
          IVar2 = (pIVar5->field_0).op2;
          IVar3 = (J->fold).ins.field_0.op2;
          (J->fold).ins.field_0.ot = 0x2913;
          (J->fold).ins.field_0.op1 = IVar2;
          (J->fold).ins.field_0.op2 = IVar3;
          TVar4 = lj_opt_fold(J);
          (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
          (J->fold).ins.field_0.op1 = IVar1;
          (J->fold).ins.field_0.ot = 0x4009;
          J_local._4_4_ = 1;
        }
        else {
          J_local._4_4_ = 0;
        }
      }
      else {
        J_local._4_4_ = 0;
      }
    }
  }
  else {
    J_local._4_4_ = 0;
  }
  return J_local._4_4_;
}

Assistant:

LJFOLD(STRREF SNEW any)
LJFOLDF(kfold_strref_snew)
{
  PHIBARRIER(fleft);
  if (irref_isk(fins->op2) && fright->i == 0) {
    return fleft->op1;  /* strref(snew(ptr, len), 0) ==> ptr */
  } else {
    /* Reassociate: strref(snew(strref(str, a), len), b) ==> strref(str, a+b) */
    IRIns *ir = IR(fleft->op1);
    if (ir->o == IR_STRREF) {
      IRRef1 str = ir->op1;  /* IRIns * is not valid across emitir. */
      PHIBARRIER(ir);
      fins->op2 = emitir(IRTI(IR_ADD), ir->op2, fins->op2); /* Clobbers fins! */
      fins->op1 = str;
      fins->ot = IRT(IR_STRREF, IRT_PGC);
      return RETRYFOLD;
    }
  }
  return NEXTFOLD;
}